

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Driver.cpp
# Opt level: O0

void __thiscall
irr::video::COpenGL3DriverBase::setViewPort(COpenGL3DriverBase *this,rect<int> *area)

{
  int iVar1;
  int viewportWidth;
  long lVar2;
  vector2d<int> *in_RSI;
  long *in_RDI;
  rect<int> rendert;
  rect<int> vp;
  GLsizei in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  undefined8 in_stack_ffffffffffffffa8;
  long lVar3;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  rect<int> local_30;
  rect<int> local_20 [2];
  
  local_20[0].UpperLeftCorner = *in_RSI;
  local_20[0].LowerRightCorner = in_RSI[1];
  (**(code **)(*in_RDI + 0x1e0))();
  (**(code **)(*in_RDI + 0x1e0))();
  core::rect<int>::rect
            ((rect<int> *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
             (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20),(int)in_stack_ffffffffffffffa8,
             in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0);
  core::rect<int>::clipAgainst(local_20,&local_30);
  iVar1 = core::rect<int>::getHeight(local_20);
  if (0 < iVar1) {
    iVar1 = core::rect<int>::getWidth(local_20);
    if (0 < iVar1) {
      lVar3 = in_RDI[0xa5];
      iVar1 = local_20[0].UpperLeftCorner.X;
      lVar2 = (**(code **)(*in_RDI + 0x1e0))();
      viewportWidth = *(int *)(lVar2 + 4) - local_20[0].UpperLeftCorner.Y;
      core::rect<int>::getHeight(local_20);
      core::rect<int>::getWidth(local_20);
      core::rect<int>::getHeight(local_20);
      COpenGLCoreCacheHandler<irr::video::COpenGL3DriverBase,_irr::video::COpenGLCoreTexture<irr::video::COpenGL3DriverBase>_>
      ::setViewport((COpenGLCoreCacheHandler<irr::video::COpenGL3DriverBase,_irr::video::COpenGLCoreTexture<irr::video::COpenGL3DriverBase>_>
                     *)CONCAT44(iVar1,in_stack_ffffffffffffffb0),(GLint)((ulong)lVar3 >> 0x20),
                    (GLint)lVar3,viewportWidth,in_stack_ffffffffffffffa0);
    }
  }
  *(vector2d<int> *)(in_RDI + 0x26) = local_20[0].UpperLeftCorner;
  *(vector2d<int> *)(in_RDI + 0x27) = local_20[0].LowerRightCorner;
  return;
}

Assistant:

void COpenGL3DriverBase::setViewPort(const core::rect<s32> &area)
{
	core::rect<s32> vp = area;
	core::rect<s32> rendert(0, 0, getCurrentRenderTargetSize().Width, getCurrentRenderTargetSize().Height);
	vp.clipAgainst(rendert);

	if (vp.getHeight() > 0 && vp.getWidth() > 0)
		CacheHandler->setViewport(vp.UpperLeftCorner.X, getCurrentRenderTargetSize().Height - vp.UpperLeftCorner.Y - vp.getHeight(), vp.getWidth(), vp.getHeight());

	ViewPort = vp;
}